

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::ComputeThickLensApproximation(RealisticCamera *this,Float *pz,Float *fz)

{
  Ray *in_RDI;
  Float FVar1;
  Ray rFilm;
  Ray *in_stack_00000088;
  Ray *in_stack_00000090;
  RealisticCamera *in_stack_00000098;
  Ray rScene;
  Ray *in_stack_000000c8;
  Float x;
  float in_stack_ffffffffffffff18;
  float y;
  float x_00;
  Float in_stack_ffffffffffffff2c;
  Vector3f *in_stack_ffffffffffffff30;
  Point3f *in_stack_ffffffffffffff38;
  RealisticCamera *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff50;
  Float *in_stack_ffffffffffffff68;
  Float *in_stack_ffffffffffffff70;
  Ray *in_stack_ffffffffffffff78;
  Ray *in_stack_ffffffffffffff80;
  
  FVar1 = FilmHandle::Diagonal((FilmHandle *)in_RDI);
  y = FVar1 * 0.001;
  x_00 = y;
  LensFrontZ(in_stack_ffffffffffffff40);
  Point3<float>::Point3(&in_RDI->o,x_00,in_stack_ffffffffffffff18,0.0);
  Vector3<float>::Vector3((Vector3<float> *)in_RDI,x_00,in_stack_ffffffffffffff18,0.0);
  MediumHandle::TaggedPointer
            ((MediumHandle *)in_RDI,(nullptr_t)CONCAT44(x_00,in_stack_ffffffffffffff18));
  Ray::Ray((Ray *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
           in_stack_ffffffffffffff2c,(MediumHandle *)in_RDI);
  Ray::Ray(in_RDI);
  FVar1 = TraceLensesFromScene((RealisticCamera *)pz,(Ray *)fz,in_stack_000000c8);
  if ((FVar1 == 0.0) && (!NAN(FVar1))) {
    ErrorExit<>(in_stack_ffffffffffffff50);
  }
  ComputeCardinalPoints
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  LensRearZ((RealisticCamera *)0x74386b);
  Point3<float>::Point3(&in_RDI->o,x_00,y,0.0);
  Vector3<float>::Vector3((Vector3<float> *)in_RDI,x_00,y,0.0);
  MediumHandle::TaggedPointer((MediumHandle *)in_RDI,(nullptr_t)CONCAT44(x_00,y));
  Ray::Ray((Ray *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
           in_stack_ffffffffffffff2c,(MediumHandle *)in_RDI);
  Ray::operator=(in_RDI,(Ray *)CONCAT44(x_00,y));
  FVar1 = TraceLensesFromFilm(in_stack_00000098,in_stack_00000090,in_stack_00000088);
  if ((FVar1 == 0.0) && (!NAN(FVar1))) {
    ErrorExit<>(in_stack_ffffffffffffff50);
  }
  ComputeCardinalPoints
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  return;
}

Assistant:

void RealisticCamera::ComputeThickLensApproximation(Float pz[2], Float fz[2]) const {
    // Find height $x$ from optical axis for parallel rays
    Float x = .001f * film.Diagonal();

    // Compute cardinal points for film side of lens system
    Ray rScene(Point3f(x, 0, LensFrontZ() + 1), Vector3f(0, 0, -1));
    Ray rFilm;
    if (!TraceLensesFromScene(rScene, &rFilm))
        ErrorExit("Unable to trace ray from scene to film for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rScene, rFilm, &pz[0], &fz[0]);

    // Compute cardinal points for scene side of lens system
    rFilm = Ray(Point3f(x, 0, LensRearZ() - 1), Vector3f(0, 0, 1));
    if (TraceLensesFromFilm(rFilm, &rScene) == 0)
        ErrorExit("Unable to trace ray from film to scene for thick lens "
                  "approximation. Is aperture stop extremely small?");
    ComputeCardinalPoints(rFilm, rScene, &pz[1], &fz[1]);
}